

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_get_preferred_sample_rate(cubeb_conflict *ctx,uint32_t *rate)

{
  undefined4 *in_RSI;
  long in_RDI;
  int local_4;
  
  if ((in_RDI != 0) && (in_RSI != (undefined4 *)0x0)) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      local_4 = -1;
    }
    else {
      *in_RSI = *(undefined4 *)(*(long *)(in_RDI + 0x20) + 0x84);
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("ctx && rate",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x2e8,"int pulse_get_preferred_sample_rate(cubeb *, uint32_t *)");
}

Assistant:

static int
pulse_get_preferred_sample_rate(cubeb * ctx, uint32_t * rate)
{
  assert(ctx && rate);
  (void)ctx;

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *rate = ctx->default_sink_info->sample_spec_rate;

  return CUBEB_OK;
}